

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O1

deBool qpXmlWriter_writeBase64(qpXmlWriter *writer,deUint8 *data,size_t numBytes)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  char d [5];
  char local_45;
  char local_44;
  char local_43;
  char local_42;
  undefined1 local_41;
  deUint8 *local_40;
  char *local_38;
  
  iVar5 = writer->xmlElementDepth;
  if (0x1f < iVar5) {
    iVar5 = 0x20;
  }
  local_40 = data;
  if (writer->xmlPrevIsStartElement != 0) {
    fwrite(">\n",2,1,(FILE *)writer->outputFile);
    writer->xmlPrevIsStartElement = 0;
  }
  if (numBytes != 0) {
    local_38 = getIndentStr_s_indentStr + (0x20 - iVar5);
    bVar1 = true;
    iVar5 = 0;
    uVar4 = 0;
    do {
      uVar6 = (int)numBytes - (int)uVar4;
      if (2 < (int)uVar6) {
        uVar6 = 3;
      }
      uVar2 = 0;
      if (1 < uVar6) {
        uVar2 = (uint)local_40[uVar4 + 1];
      }
      uVar3 = 0;
      if (2 < uVar6) {
        uVar3 = (uint)local_40[uVar4 + 2];
      }
      local_45 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [local_40[uVar4] >> 2];
      local_44 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [uVar2 >> 4 | (local_40[uVar4] & 3) << 4];
      local_43 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(uVar3 >> 6) + (uVar2 & 0xf) * 4];
      local_42 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar3 & 0x3f];
      local_41 = 0;
      if (uVar6 < 3) {
        local_42 = '=';
      }
      if (uVar6 < 2) {
        local_43 = '=';
      }
      if (bVar1) {
        fputs(local_38,(FILE *)writer->outputFile);
      }
      fputs(&local_45,(FILE *)writer->outputFile);
      iVar5 = iVar5 + 4;
      bVar1 = 0x3f < iVar5;
      if (bVar1) {
        fputc(10,(FILE *)writer->outputFile);
        iVar5 = 0;
      }
      uVar4 = uVar4 + (long)(int)uVar6;
    } while (uVar4 < numBytes);
    if (0 < iVar5) {
      fputc(10,(FILE *)writer->outputFile);
    }
  }
  return 1;
}

Assistant:

deBool qpXmlWriter_writeBase64 (qpXmlWriter* writer, const deUint8* data, size_t numBytes)
{
	static const char s_base64Table[64] =
	{
		'A','B','C','D','E','F','G','H','I','J','K','L','M',
		'N','O','P','Q','R','S','T','U','V','W','X','Y','Z',
		'a','b','c','d','e','f','g','h','i','j','k','l','m',
		'n','o','p','q','r','s','t','u','v','w','x','y','z',
		'0','1','2','3','4','5','6','7','8','9','+','/'
	};

	int			numWritten	= 0;
	size_t		srcNdx		= 0;
	deBool		writeIndent	= DE_TRUE;
	const char*	indentStr	= getIndentStr(writer->xmlElementDepth);

	DE_ASSERT(writer && data && (numBytes > 0));

	/* Close and pending writes. */
	closePending(writer);

	/* Loop all input chars. */
	while (srcNdx < numBytes)
	{
		size_t	numRead = (size_t)deMin32(3, (int)(numBytes - srcNdx));
		deUint8	s0 = data[srcNdx];
		deUint8	s1 = (numRead >= 2) ? data[srcNdx+1] : 0;
		deUint8	s2 = (numRead >= 3) ? data[srcNdx+2] : 0;
		char	d[5];

		srcNdx += numRead;

		d[0] = s_base64Table[s0 >> 2];
		d[1] = s_base64Table[((s0&0x3)<<4) | (s1>>4)];
		d[2] = s_base64Table[((s1&0xF)<<2) | (s2>>6)];
		d[3] = s_base64Table[s2&0x3F];
		d[4] = 0;

		if (numRead < 3) d[3] = '=';
		if (numRead < 2) d[2] = '=';

		/* Write indent (if needed). */
		if (writeIndent)
		{
			fprintf(writer->outputFile, "%s", indentStr);
			writeIndent = DE_FALSE;
		}

		/* Write data. */
		fprintf(writer->outputFile, "%s", &d[0]);

		/* EOL every now and then. */
		numWritten += 4;
		if (numWritten >= 64)
		{
			fprintf(writer->outputFile, "\n");
			numWritten = 0;
			writeIndent = DE_TRUE;
		}
	}

	/* Last EOL. */
	if (numWritten > 0)
		fprintf(writer->outputFile, "\n");

	DE_ASSERT(srcNdx == numBytes);
	return DE_TRUE;
}